

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall doctest::anon_unknown_15::XmlWriter::endElement(XmlWriter *this)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  XmlWriter *local_10;
  XmlWriter *this_local;
  
  local_10 = this;
  newlineIfNecessary(this);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->m_indent);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_30,&this->m_indent,0,sVar1 - 2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_indent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((this->m_tagIsOpen & 1U) == 0) {
    poVar2 = std::operator<<(this->m_os,(string *)&this->m_indent);
    poVar2 = std::operator<<(poVar2,"</");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&this->m_tags);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::operator<<(poVar2,">");
  }
  else {
    std::operator<<(this->m_os,"/>");
    this->m_tagIsOpen = false;
  }
  std::ostream::operator<<(this->m_os,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->m_tags);
  return this;
}

Assistant:

XmlWriter& XmlWriter::endElement() {
        newlineIfNecessary();
        m_indent = m_indent.substr( 0, m_indent.size()-2 );
        if( m_tagIsOpen ) {
            m_os << "/>";
            m_tagIsOpen = false;
        }
        else {
            m_os << m_indent << "</" << m_tags.back() << ">";
        }
        m_os << std::endl;
        m_tags.pop_back();
        return *this;
    }